

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRotation.hpp
# Opt level: O2

QRotation<double> * __thiscall
qclab::QRotation<double>::operator/=(QRotation<double> *this,QRotation<double> *rhs)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar1 = (rhs->angle_).cos_;
  dVar2 = (rhs->angle_).sin_;
  dVar3 = (this->angle_).cos_;
  dVar4 = (this->angle_).sin_;
  (this->angle_).cos_ = dVar1 * dVar3 + dVar4 * dVar2;
  (this->angle_).sin_ = dVar1 * dVar4 + -dVar3 * dVar2;
  return this;
}

Assistant:

inline QRotation< T >& operator/=( const QRotation< T >& rhs ) {
        update( angle_ - rhs.angle() ) ;
        return *this ;
      }